

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-after-read-timeout.c
# Opt level: O0

void on_client_connect(uv_connect_t *conn_req,int status)

{
  int iVar1;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  int r;
  int status_local;
  uv_connect_t *conn_req_local;
  
  iVar1 = uv_read_start((uv_stream_t *)&client,on_client_alloc,on_client_read);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-after-read-timeout.c"
            ,0x33,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_timer_start(&timer,on_client_timeout,1000,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-after-read-timeout.c"
            ,0x36,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  return;
}

Assistant:

static void on_client_connect(uv_connect_t* conn_req, int status) {
  int r;

  r = uv_read_start((uv_stream_t*) &client, on_client_alloc, on_client_read);
  ASSERT_OK(r);

  r = uv_timer_start(&timer, on_client_timeout, 1000, 0);
  ASSERT_OK(r);
}